

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Atom AVar2;
  char *pcVar3;
  Display *pDVar4;
  size_t sVar5;
  Atom AVar6;
  long lVar7;
  Window WVar8;
  ulong uVar9;
  Atom *pAVar10;
  undefined8 uVar11;
  long local_160;
  char *local_158;
  ulong local_150;
  Atom formats [2];
  int actualFormat;
  undefined1 local_128 [8];
  unsigned_long itemCount;
  Atom targets [4];
  XEvent reply;
  
  AVar6 = 0;
  memset(&reply,0,0xc0);
  pDVar4 = _glfw.x11.display;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_001fd3d2;
  AVar2 = (event->xkey).time;
  if (AVar2 == _glfw.x11.TARGETS) {
    pAVar10 = targets;
    targets[0] = _glfw.x11.TARGETS;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = 0x1f;
    WVar8 = (event->xkey).root;
    uVar11 = 4;
    AVar6 = 4;
LAB_001fd288:
    XChangeProperty(_glfw.x11.display,WVar8,AVar1,AVar6,0x20,0,pAVar10,uVar11);
  }
  else {
    pcVar3 = *(char **)(_glfw.x11.keyName +
                       (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    local_158 = pcVar3;
    if (AVar2 != _glfw.x11.MULTIPLE) {
      if (AVar2 != _glfw.x11.SAVE_TARGETS) {
        AVar6 = 0;
        lVar7 = 0;
        do {
          if (AVar2 == formats[lVar7]) {
            WVar8 = (event->xkey).root;
            sVar5 = strlen(pcVar3);
            XChangeProperty(pDVar4,WVar8,AVar1,AVar2,8,0,pcVar3,sVar5);
            AVar6 = (event->xselectionrequest).property;
            break;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 == 1);
        goto LAB_001fd3d2;
      }
      WVar8 = (event->xkey).root;
      uVar11 = 0;
      pAVar10 = (Atom *)0x0;
      AVar6 = _glfw.x11.NULL_;
      goto LAB_001fd288;
    }
    XGetWindowProperty(_glfw.x11.display,(event->xkey).root,AVar1,0,0x7fffffffffffffff,0,
                       _glfw.x11.ATOM_PAIR,targets,&actualFormat,&itemCount,local_128,&local_160);
    pcVar3 = local_158;
    local_150 = itemCount;
    if (itemCount != 0) {
      uVar9 = 0;
      do {
        pDVar4 = _glfw.x11.display;
        AVar1 = *(Atom *)(local_160 + uVar9 * 8);
        lVar7 = 0;
        do {
          if (AVar1 == formats[lVar7]) {
            WVar8 = (event->xkey).root;
            uVar11 = *(undefined8 *)(local_160 + 8 + uVar9 * 8);
            sVar5 = strlen(pcVar3);
            XChangeProperty(pDVar4,WVar8,uVar11,AVar1,8,0,pcVar3,sVar5);
            goto LAB_001fd389;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 == 1);
        *(undefined8 *)(local_160 + 8 + uVar9 * 8) = 0;
LAB_001fd389:
        uVar9 = uVar9 + 2;
      } while (uVar9 < local_150);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,local_160,local_150);
    XFree(local_160);
  }
  AVar6 = (event->xselectionrequest).property;
LAB_001fd3d2:
  reply.type = 0x1f;
  reply.xany.display = (event->xany).display;
  reply.xany.window = (event->xkey).root;
  reply.xkey.root = (event->xkey).subwindow;
  reply.xkey.subwindow = (event->xkey).time;
  reply.xselectionrequest.property = (event->xconfigure).above;
  reply.xkey.time = AVar6;
  XSendEvent(_glfw.x11.display,reply.xany.window,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}